

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::RemoveLogSink(LogSink *destination)

{
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *this;
  iterator local_148;
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink*const*,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::forward_iterator_tag>
  local_120 [8];
  _Safe_iterator_base local_118;
  iterator local_f8;
  iterator local_d0;
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink*const*,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::forward_iterator_tag>
  local_a8 [8];
  _Safe_iterator_base local_a0;
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
  local_80;
  _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
  local_58;
  LogSink *local_30;
  LogSink *destination_local;
  
  local_30 = destination;
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)sink_mutex_);
  this = sinks_;
  if (sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::begin
              (&local_f8,sinks_);
    std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::end
              (&local_d0,sinks_);
    std::
    remove<__gnu_debug::_Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink**,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::random_access_iterator_tag>,google::LogSink*>
              ((_Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::random_access_iterator_tag>
                *)&local_58,&local_f8,&local_d0,&local_30);
    __gnu_debug::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink*const*,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::forward_iterator_tag>
    ::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink**,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>>
              (local_120,&local_58);
    std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::end
              ((iterator *)&local_80,sinks_);
    __gnu_debug::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink*const*,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>,std::__debug::vector<google::LogSink*,std::allocator<google::LogSink*>>,std::forward_iterator_tag>
    ::
    _Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink**,std::__cxx1998::vector<google::LogSink*,std::allocator<google::LogSink*>>>>
              (local_a8,&local_80);
    std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::erase
              (&local_148,this,(const_iterator *)local_120,(const_iterator *)local_a8);
    __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base
              (&local_148.
                super__Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::bidirectional_iterator_tag>
                .
                super__Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
                .super__Safe_iterator_base);
    __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base(&local_a0);
    __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base(&local_80.super__Safe_iterator_base);
    __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base(&local_118);
    __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base(&local_58.super__Safe_iterator_base);
    __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base
              (&local_d0.
                super__Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::bidirectional_iterator_tag>
                .
                super__Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
                .super__Safe_iterator_base);
    __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base
              (&local_f8.
                super__Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::bidirectional_iterator_tag>
                .
                super__Safe_iterator<__gnu_cxx::__normal_iterator<google::LogSink_**,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>,_std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::forward_iterator_tag>
                .super__Safe_iterator_base);
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)sink_mutex_);
  return;
}

Assistant:

inline void LogDestination::RemoveLogSink(LogSink *destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&sink_mutex_);
  // This doesn't keep the sinks in order, but who cares?
  if (sinks_) {
    sinks_->erase(std::remove(sinks_->begin(), sinks_->end(), destination), sinks_->end());
  }
}